

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O0

FieldTypeId HawkTracer::parser::get_type_id(uint64_t type_size,HT_MKCREFLECT_Types_Ext data_type)

{
  runtime_error *prVar1;
  HT_MKCREFLECT_Types_Ext data_type_local;
  uint64_t type_size_local;
  
  if (data_type == HT_MKCREFLECT_TYPES_EXT_STRUCT) {
    type_size_local._4_4_ = STRUCT;
  }
  else if (data_type == HT_MKCREFLECT_TYPES_EXT_STRING) {
    type_size_local._4_4_ = STRING;
  }
  else if (data_type == HT_MKCREFLECT_TYPES_EXT_INTEGER) {
    switch(type_size) {
    case 1:
      type_size_local._4_4_ = INT8;
      break;
    case 2:
      type_size_local._4_4_ = INT16;
      break;
    default:
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,"invalid size of signed integer");
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 4:
      type_size_local._4_4_ = INT32;
      break;
    case 8:
      type_size_local._4_4_ = INT64;
    }
  }
  else if (data_type == HT_MKCREFLECT_TYPES_EXT_POINTER) {
    type_size_local._4_4_ = POINTER;
  }
  else {
    if (data_type != HT_MKCREFLECT_TYPES_EXT_UNSIGNED_INTEGER) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/event_klass.cpp"
                    ,0x54,
                    "FieldTypeId HawkTracer::parser::get_type_id(uint64_t, HT_MKCREFLECT_Types_Ext)"
                   );
    }
    switch(type_size) {
    case 1:
      type_size_local._4_4_ = UINT8;
      break;
    case 2:
      type_size_local._4_4_ = UINT16;
      break;
    default:
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,"invalid size of unsigned integer");
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 4:
      type_size_local._4_4_ = UINT32;
      break;
    case 8:
      type_size_local._4_4_ = UINT64;
    }
  }
  return type_size_local._4_4_;
}

Assistant:

FieldTypeId get_type_id(uint64_t type_size, HT_MKCREFLECT_Types_Ext data_type)
{
    switch (data_type)
    {
    case HT_MKCREFLECT_TYPES_EXT_POINTER:
        return FieldTypeId::POINTER;
    case HT_MKCREFLECT_TYPES_EXT_STRING:
        return FieldTypeId::STRING;
    case HT_MKCREFLECT_TYPES_EXT_UNSIGNED_INTEGER:
        switch (type_size)
        {
        case 1: return FieldTypeId::UINT8;
        case 2: return FieldTypeId::UINT16;
        case 4: return FieldTypeId::UINT32;
        case 8: return FieldTypeId::UINT64;
        default:
            throw std::runtime_error("invalid size of unsigned integer");
        }
        break;
    case HT_MKCREFLECT_TYPES_EXT_INTEGER:
        switch (type_size)
        {
        case 1: return FieldTypeId::INT8;
        case 2: return FieldTypeId::INT16;
        case 4: return FieldTypeId::INT32;
        case 8: return FieldTypeId::INT64;
        default:
            throw std::runtime_error("invalid size of signed integer");
        }
        break;
    case HT_MKCREFLECT_TYPES_EXT_STRUCT:
        return FieldTypeId::STRUCT;
    default: assert(0); // TODO other types
        throw std::runtime_error("invalid type id");
    }
}